

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::EulerAngles::Encode(EulerAngles *this,KDataStream *stream)

{
  KDataStream::Write<float>(stream,(float)this->m_f32Psi);
  KDataStream::Write<float>(stream,(float)this->m_f32Theta);
  KDataStream::Write<float>(stream,(float)this->m_f32Phi);
  return;
}

Assistant:

void EulerAngles::Encode( KDataStream & stream ) const
{
    stream << m_f32Psi
           << m_f32Theta
           << m_f32Phi;
}